

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  double dVar13;
  int y_1;
  int x_1;
  SDL_Event e;
  unsigned_long ticks;
  float pixel;
  int x;
  int y;
  int pitch;
  uint8_t (*rgb) [60] [80] [3];
  uint16_t y16 [60] [80];
  unsigned_long next_ticks;
  int b;
  int g;
  int r;
  int h;
  int w;
  SDL_Texture *texture;
  SDL_Renderer *renderer;
  SDL_Window *window;
  FILE *fd;
  long lStack_30;
  float scale;
  long offset;
  int run;
  int end;
  int frame;
  int paused;
  char **argv_local;
  int argc_local;
  
  if ((argc < 5) && (1 < argc)) {
    bVar4 = false;
    run = 0;
    bVar2 = false;
    bVar1 = true;
    printf("%i\n",(ulong)(uint)argc);
    if (argc < 4) {
      lStack_30 = -0xd48;
      fd._4_4_ = 0.51;
    }
    else {
      lStack_30 = atol(argv[2]);
      lStack_30 = -lStack_30;
      dVar13 = atof(argv[3]);
      fd._4_4_ = (float)(255.0 / (dVar13 + (double)lStack_30));
      printf("%li %f\n",(double)fd._4_4_,lStack_30);
    }
    __stream = fopen(argv[1],"r");
    printf("%s\n",argv[1]);
    iVar5 = SDL_Init(0x20);
    if (iVar5 < 0) {
      uVar8 = SDL_GetError();
      SDL_LogError(0,"Couldn\'t initialize SDL: %s",uVar8);
      argv_local._4_4_ = 3;
    }
    else {
      lVar9 = SDL_CreateWindow("Bat Drone Ground Station",0x1fff0000,0x1fff0000,0x280,0x1e0,0x20);
      if (lVar9 == 0) {
        uVar8 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t create window: %s",uVar8);
        argv_local._4_4_ = 3;
      }
      else {
        SDL_DisableScreenSaver();
        lVar10 = SDL_CreateRenderer(lVar9,0xffffffff,0);
        if (lVar10 == 0) {
          uVar8 = SDL_GetError();
          SDL_LogError(0,"Couldn\'t create renderer: %s",uVar8);
          argv_local._4_4_ = 3;
        }
        else {
          lVar11 = SDL_CreateTexture(lVar10,0x17101803,1,0x50,0x3c);
          if (lVar11 == 0) {
            uVar8 = SDL_GetError();
            SDL_LogError(0,"Couldn\'t create texture: %s",uVar8);
            argv_local._4_4_ = 3;
          }
          else {
            while (bVar1) {
              iVar5 = SDL_GetTicks();
              y16[0x3b]._152_8_ = ZEXT48(iVar5 + 0x28);
              if ((bVar4) || (bVar2)) {
LAB_0010185d:
                while (iVar5 = SDL_PollEvent(&y_1), iVar5 != 0) {
                  if (y_1 == 0x100) {
                    bVar1 = false;
                  }
                  else if (y_1 == 0x300) {
                    bVar4 = (bool)(bVar4 ^ 1);
                  }
                  else if (y_1 == 0x402) {
                    uVar6 = (int)(e.motion.which * 0x50) / 0x280;
                    uVar7 = (e.display.data1 * 0x3c) / 0x1e0;
                    printf("frame %i\ncoord %i,%i\nintensity %u\n",(ulong)(uint)run,(ulong)uVar6,
                           (ulong)uVar7,(ulong)y16[(long)(int)uVar7 + -1][(long)(int)uVar6 + 0x4c]);
                  }
                }
              }
              else {
                run = run + 1;
                sVar12 = fread(&rgb,0x2580,1,__stream);
                if (sVar12 != 0) {
                  SDL_LockTexture(lVar11,0,&y,&x);
                  for (pixel = 0.0; (int)pixel < 0x3c; pixel = (float)((int)pixel + 1)) {
                    for (ticks._4_4_ = 0; ticks._4_4_ < 0x50; ticks._4_4_ = ticks._4_4_ + 1) {
                      ticks._0_4_ = (float)(long)((ulong)y16[(long)(int)pixel + -1]
                                                         [(long)ticks._4_4_ + 0x4c] + lStack_30) *
                                    fd._4_4_;
                      if ((float)ticks <= 255.0) {
                        if (0.0 <= (float)ticks) {
                          uVar3 = (undefined1)(int)(float)ticks;
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 2)
                               = uVar3;
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 1)
                               = uVar3;
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3) =
                               uVar3;
                        }
                        else {
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3) = 0;
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 1)
                               = 0;
                          *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 2)
                               = 0xff;
                        }
                      }
                      else {
                        *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3) = 0xff
                        ;
                        *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 1) =
                             0;
                        *(undefined1 *)(_y + (long)(int)pixel * 0xf0 + (long)ticks._4_4_ * 3 + 2) =
                             0;
                      }
                    }
                  }
                  SDL_UnlockTexture(lVar11);
                  SDL_SetRenderDrawColor(lVar10,0xff,0xff,0xff);
                  SDL_RenderClear(lVar10);
                  SDL_RenderCopy(lVar10,lVar11,0);
                  SDL_RenderPresent(lVar10);
                  uVar6 = SDL_GetTicks();
                  e._48_8_ = ZEXT48(uVar6);
                  if ((ulong)e._48_8_ < (ulong)y16[0x3b]._152_8_) {
                    SDL_Delay((int)y16[0x3b]._152_8_ - uVar6);
                  }
                  goto LAB_0010185d;
                }
                printf("End of file\n");
                bVar2 = true;
              }
            }
            fclose(__stream);
            SDL_DestroyRenderer(lVar10);
            SDL_DestroyWindow(lVar9);
            SDL_Quit();
            argv_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    printf("Displays frames in file created by pt1cap\n\nUsage: %s <filename> [blue_level red_level]\n\n"
           ,*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc > 4 || argc < 2) {
    printf(
      "Displays frames in file created by pt1cap\n"\
      "\n"\
      "Usage: %s <filename> [blue_level red_level]\n"\
      "\n"\
    , argv[0]);
    return -1;
  }
  int paused = 0;
  int frame = 0;
  int end = 0;
  int run = 1;
  long offset;
  float scale;
  printf("%i\n", argc);
  if(argc > 3) {
    offset = -atol(argv[2]);
    scale = 255.0 / (atof(argv[3]) + offset);
    printf("%li %f\n", offset, scale);
  } else {
    // 3400 to 3900 is human
    offset = -3400; // to 3800
    scale = 255.0/(3900-3400);
  }

  FILE *fd = fopen(argv[1], "r");
  printf("%s\n", argv[1]);

  SDL_Window *window;
  SDL_Renderer *renderer;
  SDL_Texture *texture;


  if (SDL_Init(SDL_INIT_VIDEO) < 0) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s", SDL_GetError());
    return 3;
  }
  if (!(window = SDL_CreateWindow("Bat Drone Ground Station", SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED, 640, 480, SDL_WINDOW_RESIZABLE))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create window: %s", SDL_GetError());
    return 3;
  }
  SDL_DisableScreenSaver();
  if (!(renderer = SDL_CreateRenderer(window, -1, 0))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create renderer: %s", SDL_GetError());
    return 3;
  }
  if (!(texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_RGB24, SDL_TEXTUREACCESS_STREAMING, 80, 60))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create texture: %s", SDL_GetError());
    return 3;
  }

  const int w = 80;
  const int h = 60;
  const int r = 0;
  const int g = 1;
  const int b = 2;
  while(run) {
    unsigned long next_ticks = SDL_GetTicks() + 40;
    uint16_t y16[60][80];
    uint8_t (*rgb)[60][80][3];
    if(!paused && !end) {
      frame++;
      int pitch;
      if(!fread((void *) &y16, sizeof(y16), 1, fd)) {
        printf("End of file\n");
        end = 1;
        continue;
      }
      SDL_LockTexture(texture, NULL, (void **) &rgb, &pitch);
      for (int y = 0; y < h; y++) {
        for (int x = 0; x < w; x++) {
          float pixel = ((float) (y16[y][x] + offset)) * scale;
          if (pixel > 0xFF) {
            (*rgb)[y][x][r] = 0xFF;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0;
          } else if (pixel < 0) {
            (*rgb)[y][x][r] = 0;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0xFF;
          } else {
            (*rgb)[y][x][r] = (*rgb)[y][x][g] = (*rgb)[y][x][b] = pixel;
          }
        }
      }
      SDL_UnlockTexture(texture);
      SDL_SetRenderDrawColor(renderer, 255, 255, 255, 255);
      SDL_RenderClear(renderer);
      SDL_RenderCopy(renderer, texture, NULL, NULL);
      SDL_RenderPresent(renderer);
      unsigned long ticks = SDL_GetTicks();
      if (ticks < next_ticks) {
        SDL_Delay(next_ticks - ticks);
      }
    }
    SDL_Event e;
    while(SDL_PollEvent(&e)) {
      int x, y;
      switch(e.type) {
      case SDL_QUIT:
        run = 0;
        break;
      case SDL_KEYDOWN:
        paused = !paused;
        break;
      case SDL_MOUSEBUTTONUP:
        x = e.button.x * 80 / 640;
        y = e.button.y * 60 / 480;
        printf("frame %i\ncoord %i,%i\nintensity %u\n", frame, x, y, y16[y][x]);
      }
    }
  }
  fclose(fd);

  SDL_DestroyRenderer(renderer);
  SDL_DestroyWindow(window);
  SDL_Quit();
  return 0;
}